

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O2

int deqp::gles31::bb::anon_unknown_11::computeStd140BaseAlignment
              (VarType *type,deUint32 layoutFlags)

{
  int iVar1;
  int iVar2;
  DataType DVar3;
  uint uVar4;
  StructType *pSVar5;
  undefined *puVar6;
  pointer pSVar7;
  
  if (type->m_type == TYPE_ARRAY) {
    iVar1 = computeStd140BaseAlignment((type->m_data).array.elementType,layoutFlags);
  }
  else {
    if (type->m_type == TYPE_BASIC) {
      DVar3 = (type->m_data).basic.type;
      if (DVar3 - TYPE_FLOAT_MAT2 < 9 || DVar3 - TYPE_DOUBLE_MAT2 < 9) {
        if ((layoutFlags & 0x10) == 0) {
          iVar1 = glu::getDataTypeMatrixNumRows(DVar3);
        }
        else {
          iVar1 = glu::getDataTypeMatrixNumColumns(DVar3);
        }
        DVar3 = glu::getDataTypeFloatVec(iVar1);
        uVar4 = DVar3 - TYPE_FLOAT;
        if (0x25 < uVar4) {
          return 0;
        }
        puVar6 = &DAT_00862e98;
      }
      else {
        uVar4 = DVar3 - TYPE_FLOAT;
        if (0x25 < uVar4) {
          return 0;
        }
        puVar6 = &DAT_00862f30;
      }
      return *(int *)(puVar6 + (ulong)uVar4 * 4);
    }
    pSVar5 = (type->m_data).structPtr;
    iVar1 = 0;
    for (pSVar7 = (pSVar5->m_members).
                  super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pSVar7 != (pSVar5->m_members).
                  super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                  super__Vector_impl_data._M_finish; pSVar7 = pSVar7 + 1) {
      iVar2 = computeStd140BaseAlignment(&pSVar7->m_type,layoutFlags);
      if (iVar1 <= iVar2) {
        iVar1 = iVar2;
      }
      pSVar5 = (type->m_data).structPtr;
    }
  }
  return iVar1 + 0xfU & 0xfffffff0;
}

Assistant:

int computeStd140BaseAlignment (const VarType& type, deUint32 layoutFlags)
{
	const int vec4Alignment = (int)sizeof(deUint32)*4;

	if (type.isBasicType())
	{
		glu::DataType basicType = type.getBasicType();

		if (glu::isDataTypeMatrix(basicType))
		{
			const bool	isRowMajor	= !!(layoutFlags & LAYOUT_ROW_MAJOR);
			const int	vecSize		= isRowMajor ? glu::getDataTypeMatrixNumColumns(basicType)
												 : glu::getDataTypeMatrixNumRows(basicType);
			const int	vecAlign	= deAlign32(getDataTypeByteAlignment(glu::getDataTypeFloatVec(vecSize)), vec4Alignment);

			return vecAlign;
		}
		else
			return getDataTypeByteAlignment(basicType);
	}
	else if (type.isArrayType())
	{
		int elemAlignment = computeStd140BaseAlignment(type.getElementType(), layoutFlags);

		// Round up to alignment of vec4
		return deAlign32(elemAlignment, vec4Alignment);
	}
	else
	{
		DE_ASSERT(type.isStructType());

		int maxBaseAlignment = 0;

		for (StructType::ConstIterator memberIter = type.getStructPtr()->begin(); memberIter != type.getStructPtr()->end(); memberIter++)
			maxBaseAlignment = de::max(maxBaseAlignment, computeStd140BaseAlignment(memberIter->getType(), layoutFlags));

		return deAlign32(maxBaseAlignment, vec4Alignment);
	}
}